

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O2

ConstantValue<long,_(flow::LiteralType)2> * __thiscall
flow::IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
          *table,long *literal)

{
  pointer puVar1;
  __uniq_ptr_impl<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
  _Var2;
  ConstantValue<long,_(flow::LiteralType)2> *in_RAX;
  pointer *__ptr;
  long lVar3;
  _Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false> local_18;
  
  puVar1 = (table->
           super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = 0;
  do {
    if ((long)(table->
              super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3 == lVar3) {
      local_18._M_head_impl = in_RAX;
      std::make_unique<flow::ConstantValue<long,(flow::LiteralType)2>,long_const&>
                ((long *)&local_18);
      std::
      vector<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>,std::allocator<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>>
      ::
      emplace_back<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>
                ((vector<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>,std::allocator<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>>
                  *)table,(unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
                           *)&local_18);
      if (local_18._M_head_impl != (ConstantValue<long,_(flow::LiteralType)2> *)0x0) {
        (*((local_18._M_head_impl)->super_Constant).super_Value._vptr_Value[1])();
      }
      return (table->
             super__Vector_base<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
             .super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>.
             _M_head_impl;
    }
    _Var2._M_t.
    super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
    .super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>._M_head_impl =
         puVar1[lVar3]._M_t.
         super___uniq_ptr_impl<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
         ._M_t;
    lVar3 = lVar3 + 1;
  } while (*(long *)((long)_Var2._M_t.
                           super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
                           .
                           super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>
                           ._M_head_impl + 0x48) != *literal);
  return (ConstantValue<long,_(flow::LiteralType)2> *)
         _Var2._M_t.
         super__Tuple_impl<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
         .super__Head_base<0UL,_flow::ConstantValue<long,_(flow::LiteralType)2>_*,_false>.
         _M_head_impl;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}